

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffmkls(fitsfile *fptr,char *keyname,char *value,char *incomm,int *status)

{
  char *__ptr;
  int iVar1;
  char *__dest;
  size_t sVar2;
  int commlen;
  int keypos;
  int vlen;
  int nkeys;
  char *local_a0;
  long local_98;
  int tmpcommlen;
  int tmpvlen;
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  if ((incomm == (char *)0x0) || (*incomm == '&')) {
    ffghps(fptr,&nkeys,&keypos,status);
    iVar1 = ffgkcsl(fptr,keyname,&vlen,&commlen,status);
    if (iVar1 != 0) goto LAB_0018ebbb;
    local_98 = (long)vlen;
    local_a0 = (char *)malloc(local_98 + 1);
    iVar1 = commlen;
    __dest = (char *)malloc((long)commlen + 1);
    __ptr = local_a0;
    ffgskyc(fptr,keyname,1,(int)local_98,iVar1,local_a0,&tmpvlen,__dest,&tmpcommlen,status);
    free(__ptr);
    ffgrec(fptr,keypos + -1,card,status);
  }
  else {
    sVar2 = strlen(incomm);
    commlen = (int)sVar2;
    if (commlen == 0) {
      __dest = (char *)0x0;
    }
    else {
      __dest = (char *)malloc((long)(commlen + 1));
      strcpy(__dest,incomm);
    }
  }
  iVar1 = ffdkey(fptr,keyname,status);
  if (iVar1 < 1) {
    ffghps(fptr,&nkeys,&keypos,status);
    fits_make_longstr_key_util(fptr,keyname,value,__dest,keypos,status);
  }
  if (__dest != (char *)0x0) {
    free(__dest);
  }
LAB_0018ebbb:
  return *status;
}

Assistant:

int ffmkls( fitsfile *fptr,           /* I - FITS file pointer        */
            const char *keyname,      /* I - name of keyword to write */
            const char *value,        /* I - keyword value            */
            const char *incomm,       /* I - keyword comment          */
            int  *status)             /* IO - error status            */
/*
  Modify the value and optionally the comment of a long string keyword.
  This routine supports the
  HEASARC long string convention and can modify arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name COMTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  69 characters in length.

  This routine is not very efficient, so it should be used sparingly.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD], tmpkeyname[FLEN_CARD];
    char tstring[FLEN_VALUE], *cptr;
    char *comm=0, *tmplongval=0;
    int next, remain, nquote, nchar, namelen, contin, tstatus = -1;
    int nkeys, keypos;
    int vlen, commlen, tmpvlen, tmpcommlen;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (!incomm || incomm[0] == '&')  /* preserve the old comment string */
    {
        ffghps(fptr, &nkeys, &keypos, status); /* save current position */
        
        if (ffgkcsl(fptr, keyname, &vlen, &commlen, status))
           return(*status); /* keyword doesn't exist or is bad format */
        tmplongval = (char *)malloc(vlen+1);
        comm = (char *)malloc(commlen+1);
        ffgskyc(fptr, keyname, 1, vlen, commlen, tmplongval, &tmpvlen,
                comm, &tmpcommlen, status);
        free(tmplongval); 

        /* move back to previous position to ensure that we delete */
        /* the right keyword in case there are more than one keyword */
        /* with this same name. */
        ffgrec(fptr, keypos - 1, card, status); 
    } else {
        /* copy the input comment string */
        commlen = (int)strlen(incomm);
        if (commlen)
        {
           comm = (char *)malloc(commlen+1);
           strcpy(comm,incomm);
        }
    }

    /* delete the old keyword */
    if (ffdkey(fptr, keyname, status) > 0)
    {
        if (comm)  free(comm);
        return(*status);            /* keyword doesn't exist */
    }

    ffghps(fptr, &nkeys, &keypos, status); /* save current position */

    fits_make_longstr_key_util(fptr, keyname, value, comm, keypos, status);

    if (comm)  free(comm);
    return(*status);
}